

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChRotUtils.h
# Opt level: O2

void chrono::fea::rotutils::RotAndDRot
               (ChVector<double> *phi,ChMatrix33<double> *Phi,ChMatrix33<double> *Ga)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  double coeff [3];
  ChMatrix33<double> Eye;
  ChStarMatrix33<double> pxpx;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>
  local_158;
  double local_128;
  double local_120;
  double local_118;
  ChMatrix33<double> local_108;
  ChStarMatrix33<double> local_c0;
  Matrix<double,_3,_3,_1,_3,_3> local_78;
  
  CoeffC<chrono::ChVector<double>,double>(phi,phi,&local_128);
  ChMatrix33<double>::ChMatrix33(&local_108,1.0);
  local_78.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
       0.0;
  local_78.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
       local_128 * phi->m_data[2];
  auVar3._0_8_ = -local_78.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                  m_data.array[3];
  auVar3._8_8_ = 0x8000000000000000;
  local_78.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
       (double)vmovlpd_avx(auVar3);
  local_78.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] =
       0.0;
  auVar1._0_8_ = local_128 * phi->m_data[0];
  auVar1._8_8_ = local_128 * phi->m_data[1];
  local_78.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
       -auVar1._0_8_;
  local_78.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] =
       -auVar1._8_8_;
  local_78.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
       (double)vmovhpd_avx(auVar1);
  local_78.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] =
       (double)vmovlpd_avx(auVar1);
  local_78.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
       0.0;
  local_158._0_8_ = phi->m_data[0] * local_120;
  local_158.m_lhs.m_lhs = (LhsNested)(phi->m_data[1] * local_120);
  local_158.m_lhs.m_rhs = (RhsNested)(phi->m_data[2] * local_120);
  ChStarMatrix33<double>::ChStarMatrix33(&local_c0,phi,(ChVector<double> *)&local_158);
  local_158.m_lhs.m_lhs = &local_108.super_Matrix<double,_3,_3,_1,_3,_3>;
  local_158.m_lhs.m_rhs = &local_78;
  local_158.m_rhs = &local_c0.super_Matrix<double,_3,_3,_1,_3,_3>;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,3,3,1,3,3>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,3,3,1,3,3>const,Eigen::Matrix<double,3,3,1,3,3>const>const,Eigen::Matrix<double,3,3,1,3,3>const>>
            (&Phi->super_Matrix<double,_3,_3,_1,_3,_3>,&local_158);
  local_78.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
       0.0;
  local_78.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
       local_120 * phi->m_data[2];
  auVar4._0_8_ = -local_78.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                  m_data.array[3];
  auVar4._8_8_ = 0x8000000000000000;
  local_78.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
       (double)vmovlpd_avx(auVar4);
  local_78.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] =
       0.0;
  auVar2._0_8_ = local_120 * phi->m_data[0];
  auVar2._8_8_ = local_120 * phi->m_data[1];
  local_78.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
       -auVar2._0_8_;
  local_78.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] =
       -auVar2._8_8_;
  local_78.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
       (double)vmovhpd_avx(auVar2);
  local_78.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] =
       (double)vmovlpd_avx(auVar2);
  local_78.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
       0.0;
  local_158._0_8_ = phi->m_data[0] * local_118;
  local_158.m_lhs.m_lhs = (LhsNested)(phi->m_data[1] * local_118);
  local_158.m_lhs.m_rhs = (RhsNested)(phi->m_data[2] * local_118);
  ChStarMatrix33<double>::ChStarMatrix33(&local_c0,phi,(ChVector<double> *)&local_158);
  local_158.m_lhs.m_lhs = &local_108.super_Matrix<double,_3,_3,_1,_3,_3>;
  local_158.m_lhs.m_rhs = &local_78;
  local_158.m_rhs = &local_c0.super_Matrix<double,_3,_3,_1,_3,_3>;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,3,3,1,3,3>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,3,3,1,3,3>const,Eigen::Matrix<double,3,3,1,3,3>const>const,Eigen::Matrix<double,3,3,1,3,3>const>>
            (&Ga->super_Matrix<double,_3,_3,_1,_3,_3>,&local_158);
  return;
}

Assistant:

void RotAndDRot(const ChVector<>& phi, ChMatrix33<>& Phi, ChMatrix33<>& Ga) {
    double coeff[COEFF_C];

    CoeffC(phi, phi, coeff);

    ChMatrix33<> Eye(1);
    
    {
        ChStarMatrix33<> Phix(phi * coeff[0]);
        ChStarMatrix33<> pxpx(phi, phi * coeff[1]);
        Phi = Eye + Phix + pxpx;  // I + c[0] * phi x + c[1] * phi x phi x
    }

    {
        ChStarMatrix33<> Phix(phi * coeff[1]);
        ChStarMatrix33<> pxpx(phi, phi * coeff[2]);
        Ga = Eye + Phix + pxpx; // I + c[1] * phi x + c[2] * phi x phi x
    }

    return;
}